

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O2

int Abc_NtkMfsInterplateEval(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  
  puVar4 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,0);
  uVar1 = *puVar4;
  uVar5 = uVar1;
  if (nCands == 6) {
    uVar5 = puVar4[1];
  }
  puVar4 = Abc_NtkMfsInterplateTruth(p,pCands,nCands,1);
  uVar6 = ~*puVar4;
  if (nCands == 6) {
    uVar6 = ~puVar4[1];
  }
  iVar2 = Extra_WordCountOnes(uVar1 ^ ~*puVar4);
  iVar3 = Extra_WordCountOnes(uVar6 ^ uVar5);
  return iVar3 + iVar2;
}

Assistant:

int Abc_NtkMfsInterplateEval( Mfs_Man_t * p, int * pCands, int nCands )
{
    unsigned * pTruth, uTruth0[2], uTruth1[2];
    int nCounter;
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 0 );
    if ( nCands == 6 )
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[1];
    }
    else
    {
        uTruth1[0] = pTruth[0];
        uTruth1[1] = pTruth[0];
    }
    pTruth = Abc_NtkMfsInterplateTruth( p, pCands, nCands, 1 );
    if ( nCands == 6 )
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[1];
    }
    else
    {
        uTruth0[0] = ~pTruth[0];
        uTruth0[1] = ~pTruth[0];
    }
    nCounter  = Extra_WordCountOnes( uTruth0[0] ^ uTruth1[0] );
    nCounter += Extra_WordCountOnes( uTruth0[1] ^ uTruth1[1] );
//    printf( "%d ", nCounter );
    return nCounter;
}